

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O1

void __thiscall VectorsTest_FP3SumAssignment_Test::TestBody(VectorsTest_FP3SumAssignment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  double dStack_50;
  double local_48 [2];
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  double local_28;
  double dStack_20;
  double local_18 [2];
  
  local_28 = 9.0;
  dStack_20 = -3.0;
  local_18[0] = 0.0;
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4022000000000000
  ;
  dStack_50 = -3.0;
  local_48[0] = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            (local_38,"v1.x","FP3(9, -3, 0).x",&local_28,(double *)&local_58);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x105,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x4022000000000000;
    dStack_50 = -3.0;
    local_48[0] = 0.0;
    testing::internal::CmpHelperEQ<double,double>
              (local_38,"v1.y","FP3(9, -3, 0).y",&dStack_20,&dStack_50);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                 ,0x105,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x4022000000000000;
      dStack_50 = -3.0;
      local_48[0] = 0.0;
      testing::internal::CmpHelperEQ<double,double>
                (local_38,"v1.z","FP3(9, -3, 0).z",local_18,local_48);
      if (local_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x105,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3Truncate)
{
    FP3 v(5.2, 7.5, -1.4);
    ASSERT_EQ_INT3(truncate(v), Int3(5, 7, -1));
}